

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap)

{
  ushort uVar1;
  short sVar2;
  u32 uVar3;
  ExprList *pEVar4;
  SrcList *pSVar5;
  Table *pTab;
  Schema *pSVar6;
  i16 *piVar7;
  undefined1 auVar8 [16];
  char cVar9;
  u8 uVar10;
  int iVar11;
  uint uVar12;
  Vdbe *p;
  Select *pSVar13;
  Expr *pEVar14;
  Expr *pLeft;
  CollSeq *pCVar15;
  byte bVar16;
  uint uVar17;
  Schema **ppSVar18;
  Op *pOVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ExprList_item *pEVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Index *local_c8;
  int *local_b8;
  Walker local_60;
  
  iVar21 = pParse->nTab;
  pParse->nTab = iVar21 + 1;
  p = sqlite3GetVdbe(pParse);
  iVar26 = 0;
  if (prRhsHasNull == (int *)0x0) {
    local_b8 = (int *)0x0;
  }
  else {
    local_b8 = prRhsHasNull;
    if ((pX->flags & 0x800) != 0) {
      pEVar4 = ((pX->x).pSelect)->pEList;
      uVar17 = pEVar4->nExpr;
      if ((int)uVar17 < 1) {
        uVar27 = 0;
      }
      else {
        pEVar24 = pEVar4->a;
        uVar27 = 0;
        do {
          iVar11 = sqlite3ExprCanBeNull(pEVar24->pExpr);
          if (iVar11 != 0) goto LAB_0016bfe4;
          uVar27 = uVar27 + 1;
          pEVar24 = pEVar24 + 1;
        } while (uVar17 != uVar27);
        uVar27 = (ulong)uVar17;
      }
LAB_0016bfe4:
      local_b8 = prRhsHasNull;
      if ((uint)uVar27 == uVar17) {
        local_b8 = (int *)0x0;
      }
    }
  }
  if (pParse->nErr == 0) {
    iVar26 = 0;
    if (((((pX->flags & 0x820) == 0x800) &&
         (pSVar13 = (pX->x).pSelect, pSVar13->pPrior == (Select *)0x0)) &&
        ((pSVar13->selFlags & 9) == 0)) &&
       (((pSVar13->pLimit == (Expr *)0x0 && (pSVar13->pWhere == (Expr *)0x0)) &&
        ((pSVar5 = pSVar13->pSrc, pSVar5->nSrc == 1 &&
         ((pSVar5->a[0].pSelect == (Select *)0x0 && ((pSVar5->a[0].pTab)->nModuleArg == 0)))))))) {
      lVar20 = (long)pSVar13->pEList->nExpr;
      if (0 < lVar20) {
        lVar23 = 0;
        do {
          if (**(char **)((long)&pSVar13->pEList->a[0].pExpr + lVar23) != -0x62) goto LAB_0016c0e8;
          lVar23 = lVar23 + 0x20;
        } while (lVar20 * 0x20 != lVar23);
      }
    }
    else {
LAB_0016c0e8:
      pSVar13 = (Select *)0x0;
    }
    if (pSVar13 != (Select *)0x0) {
      pEVar4 = pSVar13->pEList;
      uVar17 = pEVar4->nExpr;
      pTab = pSVar13->pSrc->a[0].pTab;
      if (pTab->pSchema == (Schema *)0x0) {
        iVar11 = -0x4240;
      }
      else {
        iVar11 = -0x10000;
        ppSVar18 = &pParse->db->aDb->pSchema;
        do {
          iVar11 = iVar11 + 0x10000;
          pSVar6 = *ppSVar18;
          ppSVar18 = ppSVar18 + 4;
        } while (pSVar6 != pTab->pSchema);
        iVar11 = iVar11 >> 0x10;
      }
      sqlite3CodeVerifySchema(pParse,iVar11);
      sqlite3TableLock(pParse,iVar11,pTab->tnum,'\0',pTab->zName);
      if ((uVar17 == 1) && ((pEVar4->a[0].pExpr)->iColumn < 0)) {
        iVar26 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
        sqlite3OpenTable(pParse,iVar21,iVar11,pTab,0x6d);
        sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName)
        ;
        if (p->db->mallocFailed == '\0') {
          iVar11 = p->nOp + -1;
          if (-1 < iVar26) {
            iVar11 = iVar26;
          }
          pOVar19 = p->aOp + iVar11;
        }
        else {
          pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar19->p2 = p->nOp;
        iVar26 = 1;
      }
      else {
        if ((int)uVar17 < 1) {
LAB_0016c267:
          local_c8 = pTab->pIndex;
          if (local_c8 != (Index *)0x0) {
            do {
              uVar1 = local_c8->nColumn;
              iVar26 = 0;
              if (uVar1 < 0x3f) {
                iVar26 = 0;
                if (((int)uVar17 <= (int)(uint)uVar1) &&
                   (((inFlags & 4) == 0 ||
                    ((iVar26 = 0, (int)(uint)local_c8->nKeyCol <= (int)uVar17 &&
                     (((int)(uint)uVar1 <= (int)uVar17 || (iVar26 = 0, local_c8->onError != '\0'))))
                    )))) {
                  if ((int)uVar17 < 1) {
                    uVar27 = 0;
                  }
                  else {
                    lVar20 = 0;
                    uVar27 = 0;
                    do {
                      pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar20);
                      pEVar14 = pEVar4->a[lVar20].pExpr;
                      pCVar15 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar14);
                      piVar7 = local_c8->aiColumn;
                      sVar2 = pEVar14->iColumn;
                      uVar25 = 0;
                      do {
                        if ((piVar7[uVar25] == sVar2) &&
                           ((pCVar15 == (CollSeq *)0x0 ||
                            (iVar26 = sqlite3StrICmp(pCVar15->zName,local_c8->azColl[uVar25]),
                            iVar26 == 0)))) goto LAB_0016c349;
                        uVar25 = uVar25 + 1;
                      } while (uVar17 != uVar25);
                      uVar25 = (ulong)uVar17;
LAB_0016c349:
                      if (((uint)uVar25 == uVar17) || ((uVar27 >> (uVar25 & 0x3f) & 1) != 0)) {
                        bVar28 = false;
                      }
                      else {
                        uVar27 = uVar27 | 1L << ((byte)uVar25 & 0x3f);
                        bVar28 = true;
                        if (aiMap != (int *)0x0) {
                          aiMap[lVar20] = (uint)uVar25;
                        }
                      }
                    } while ((bVar28) && (lVar20 = lVar20 + 1, lVar20 < (int)uVar17));
                  }
                  iVar26 = 0;
                  if ((uVar27 ^ -1L << ((byte)uVar17 & 0x3f)) == 0xffffffffffffffff) {
                    iVar26 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
                    sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",local_c8->zName)
                    ;
                    sqlite3VdbeAddOp3(p,0x6d,iVar21,local_c8->tnum,iVar11);
                    sqlite3VdbeSetP4KeyInfo(pParse,local_c8);
                    bVar16 = *local_c8->aSortOrder;
                    if (local_b8 != (int *)0x0) {
                      iVar22 = pParse->nMem + 1;
                      pParse->nMem = iVar22;
                      *local_b8 = iVar22;
                      if (uVar17 == 1) {
                        sqlite3SetHasNullFlag(p,iVar21,iVar22);
                      }
                    }
                    pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
                    if (p->db->mallocFailed == '\0') {
                      iVar22 = p->nOp + -1;
                      if (-1 < iVar26) {
                        iVar22 = iVar26;
                      }
                      pOVar19 = p->aOp + iVar22;
                    }
                    iVar26 = bVar16 + 3;
                    pOVar19->p2 = p->nOp;
                  }
                }
              }
              local_c8 = local_c8->pNext;
            } while ((local_c8 != (Index *)0x0) && (iVar26 == 0));
            goto LAB_0016c003;
          }
        }
        else {
          pEVar24 = pEVar4->a;
          uVar27 = 0;
          do {
            pEVar14 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar27);
            lVar20 = (long)pEVar24->pExpr->iColumn;
            if (lVar20 < 0) {
              bVar16 = 0x44;
            }
            else {
              bVar16 = pTab->aCol[lVar20].affinity;
            }
            cVar9 = sqlite3CompareAffinity(pEVar14,bVar16);
            bVar28 = (byte)(cVar9 + 0xbfU) < 2;
            uVar27 = uVar27 + 1;
          } while ((uVar27 < uVar17) && (pEVar24 = pEVar24 + 1, 0x42 < bVar16 || bVar28));
          if (0x42 < bVar16 || bVar28) goto LAB_0016c267;
        }
        iVar26 = 0;
      }
    }
  }
LAB_0016c003:
  if (((iVar26 == 0) && (iVar26 = 0, (inFlags & 1) != 0)) && ((pX->flags & 0x800) == 0)) {
    pEVar14 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    local_60.eCode = '\x01';
    local_60.xExprCallback = exprNodeIsConstant;
    local_60.xSelectCallback = sqlite3SelectWalkFail;
    local_60.u.n = 0;
    if (pX != (Expr *)0x0) {
      walkExpr(&local_60,pX);
    }
    pX->pLeft = pEVar14;
    if ((local_60.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) {
      iVar26 = 5;
    }
  }
  if (iVar26 == 0) {
    uVar3 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar26 = 2;
      uVar17 = 0;
      if (local_b8 == (int *)0x0) {
        iVar21 = 0;
      }
      else {
        iVar21 = pParse->nMem + 1;
        pParse->nMem = iVar21;
        *local_b8 = iVar21;
        uVar17 = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar26 = 2;
      iVar21 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar12 = pX->flags & 0x800;
        uVar17 = uVar12 >> 0xb ^ 1;
        iVar26 = 2 - (uint)(uVar12 == 0);
      }
      else {
        uVar17 = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar21,uVar17);
    pParse->nQueryLoop = uVar3;
  }
  else {
    pX->iTable = iVar21;
  }
  auVar8 = _DAT_001960a0;
  if (aiMap == (int *)0x0) {
    return iVar26;
  }
  if (0xfffffffd < iVar26 - 5U) {
    return iVar26;
  }
  pEVar14 = pX->pLeft;
  uVar10 = pEVar14->op;
  if (uVar10 == 0xa4) {
    uVar10 = pEVar14->op2;
  }
  if (uVar10 == '\x7f') {
    pSVar13 = (pEVar14->x).pSelect;
  }
  else {
    uVar17 = 1;
    if (uVar10 != 0xa5) goto LAB_0016c560;
    pSVar13 = (Select *)&pEVar14->x;
  }
  uVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar13->pEList)->pList->nExpr;
LAB_0016c560:
  if (0 < (int)uVar17) {
    lVar20 = (ulong)uVar17 - 1;
    auVar29._8_4_ = (int)lVar20;
    auVar29._0_8_ = lVar20;
    auVar29._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar27 = 0;
    auVar29 = auVar29 ^ _DAT_001960a0;
    auVar30 = _DAT_00196090;
    do {
      auVar31 = auVar30 ^ auVar8;
      if ((bool)(~(auVar31._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar31._0_4_ ||
                  auVar29._4_4_ < auVar31._4_4_) & 1)) {
        aiMap[uVar27] = (int)uVar27;
      }
      if ((auVar31._12_4_ != auVar29._12_4_ || auVar31._8_4_ <= auVar29._8_4_) &&
          auVar31._12_4_ <= auVar29._12_4_) {
        aiMap[uVar27 + 1] = (int)uVar27 + 1;
      }
      uVar27 = uVar27 + 2;
      lVar20 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 2;
      auVar30._8_8_ = lVar20 + 2;
    } while ((uVar17 + 1 & 0xfffffffe) != uVar27);
  }
  return iVar26;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap                 /* Mapping from Index fields to RHS fields */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  return eType;
}